

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O1

string * __thiscall
absl::time_internal::cctz::time_zone::version_abi_cxx11_
          (string *__return_storage_ptr__,time_zone *this)

{
  time_zone tVar1;
  
  tVar1 = (time_zone)this->impl_;
  if (tVar1.impl_ == (Impl *)0x0) {
    tVar1 = Impl::UTC();
  }
  (*(((tVar1.impl_)->zone_)._M_t.
     super___uniq_ptr_impl<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>_>
     ._M_t.
     super__Tuple_impl<0UL,_absl::time_internal::cctz::TimeZoneIf_*,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>_>
     .super__Head_base<0UL,_absl::time_internal::cctz::TimeZoneIf_*,_false>._M_head_impl)->
    _vptr_TimeZoneIf[6])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string time_zone::version() const { return effective_impl().Version(); }